

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZWcompress.cpp
# Opt level: O0

void __thiscall LZWcompress::LZWcompress(LZWcompress *this,uchar *YUVdata,uint size)

{
  __cxx11 local_40 [32];
  uint local_20;
  uint local_1c;
  uint i;
  uint size_local;
  uchar *YUVdata_local;
  LZWcompress *this_local;
  
  local_1c = size;
  _i = YUVdata;
  YUVdata_local = (uchar *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->YUVdata_n);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map(&this->encode_map);
  std::
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->decode_map);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->lzw_encode_output);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->lzw_decode_output);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    std::__cxx11::to_string(local_40,(uint)_i[local_20]);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->YUVdata_n,(value_type *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

LZWcompress::LZWcompress(uchar * YUVdata, uint size){
	for(uint i = 0; i < size; i++){
		YUVdata_n.push_back(std::to_string(int(YUVdata[i])));
	}
}